

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O1

StatusOr<draco::EncodedGeometryType> *
draco::Decoder::GetEncodedGeometryType
          (StatusOr<draco::EncodedGeometryType> *__return_storage_ptr__,DecoderBuffer *in_buffer)

{
  _Alloc_hider _Var1;
  Status _local_status;
  DracoHeader header;
  DecoderBuffer temp_buffer;
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  long local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  DracoHeader local_64;
  DecoderBuffer local_58;
  
  local_58.bit_mode_ = in_buffer->bit_mode_;
  local_58._49_1_ = in_buffer->field_0x31;
  local_58.bitstream_version_ = in_buffer->bitstream_version_;
  local_58._52_4_ = *(undefined4 *)&in_buffer->field_0x34;
  local_58.data_ = in_buffer->data_;
  local_58.data_size_ = in_buffer->data_size_;
  local_58.pos_ = in_buffer->pos_;
  local_58.bit_decoder_.bit_buffer_ = (in_buffer->bit_decoder_).bit_buffer_;
  local_58.bit_decoder_.bit_buffer_end_ = (in_buffer->bit_decoder_).bit_buffer_end_;
  local_58.bit_decoder_.bit_offset_ = (in_buffer->bit_decoder_).bit_offset_;
  PointCloudDecoder::DecodeHeader((Status *)local_b0,&local_58,&local_64);
  if (local_b0._0_4_ == OK) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_p != &local_98) {
      operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
    }
    if (local_64.encoder_type < 2) {
      (__return_storage_ptr__->status_).code_ = OK;
      (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
      (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
      (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->value_ = (uint)local_64.encoder_type;
      goto LAB_0011ded0;
    }
    local_88 = &local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"Unsupported geometry type.","");
    local_b0._0_4_ = DRACO_ERROR;
    local_a8._M_p = (pointer)&local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_88,local_88->_M_local_buf + local_80);
    (__return_storage_ptr__->status_).code_ = local_b0._0_4_;
    (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(__return_storage_ptr__->status_).error_msg_,local_a8._M_p,
               local_a8._M_p + local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_p != &local_98) {
      operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
    }
    _Var1._M_p = (pointer)local_88;
    if (local_88 == &local_78) goto LAB_0011ded0;
  }
  else {
    (__return_storage_ptr__->status_).code_ = local_b0._0_4_;
    (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(__return_storage_ptr__->status_).error_msg_,local_a8._M_p,
               local_a8._M_p + local_a0);
    local_78._M_allocated_capacity = local_98._M_allocated_capacity;
    _Var1._M_p = local_a8._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_p == &local_98) goto LAB_0011ded0;
  }
  operator_delete(_Var1._M_p,local_78._M_allocated_capacity + 1);
LAB_0011ded0:
  DecoderBuffer::BitDecoder::~BitDecoder(&local_58.bit_decoder_);
  return __return_storage_ptr__;
}

Assistant:

StatusOr<EncodedGeometryType> Decoder::GetEncodedGeometryType(
    DecoderBuffer *in_buffer) {
  DecoderBuffer temp_buffer(*in_buffer);
  DracoHeader header;
  DRACO_RETURN_IF_ERROR(PointCloudDecoder::DecodeHeader(&temp_buffer, &header));
  if (header.encoder_type >= NUM_ENCODED_GEOMETRY_TYPES) {
    return Status(Status::DRACO_ERROR, "Unsupported geometry type.");
  }
  return static_cast<EncodedGeometryType>(header.encoder_type);
}